

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_SAX2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing SAX2 : 38 of 38 functions ...\n");
  }
  iVar1 = test_docbDefaultSAXHandlerInit();
  iVar2 = test_htmlDefaultSAXHandlerInit();
  iVar3 = test_xmlDefaultSAXHandlerInit();
  iVar4 = test_xmlSAX2AttributeDecl();
  iVar5 = test_xmlSAX2CDataBlock();
  iVar6 = test_xmlSAX2Characters();
  iVar7 = test_xmlSAX2Comment();
  iVar8 = test_xmlSAX2ElementDecl();
  iVar9 = test_xmlSAX2EndDocument();
  iVar10 = test_xmlSAX2EndElement();
  iVar11 = test_xmlSAX2EndElementNs();
  iVar12 = test_xmlSAX2EntityDecl();
  iVar13 = test_xmlSAX2ExternalSubset();
  iVar14 = test_xmlSAX2GetColumnNumber();
  iVar15 = test_xmlSAX2GetEntity();
  iVar16 = test_xmlSAX2GetLineNumber();
  iVar17 = test_xmlSAX2GetParameterEntity();
  iVar18 = test_xmlSAX2GetPublicId();
  iVar19 = test_xmlSAX2GetSystemId();
  iVar20 = test_xmlSAX2HasExternalSubset();
  iVar21 = test_xmlSAX2HasInternalSubset();
  iVar22 = test_xmlSAX2IgnorableWhitespace();
  iVar23 = test_xmlSAX2InitDefaultSAXHandler();
  iVar24 = test_xmlSAX2InitDocbDefaultSAXHandler();
  iVar25 = test_xmlSAX2InitHtmlDefaultSAXHandler();
  iVar26 = test_xmlSAX2InternalSubset();
  iVar27 = test_xmlSAX2IsStandalone();
  iVar28 = test_xmlSAX2NotationDecl();
  iVar29 = test_xmlSAX2ProcessingInstruction();
  iVar30 = test_xmlSAX2Reference();
  iVar31 = test_xmlSAX2ResolveEntity();
  iVar32 = test_xmlSAX2SetDocumentLocator();
  iVar33 = test_xmlSAX2StartDocument();
  iVar34 = test_xmlSAX2StartElement();
  iVar35 = test_xmlSAX2StartElementNs();
  iVar36 = test_xmlSAX2UnparsedEntityDecl();
  iVar37 = test_xmlSAXDefaultVersion();
  iVar38 = test_xmlSAXVersion();
  uVar39 = iVar38 + iVar37 + iVar36 + iVar35 + iVar34 + iVar33 + iVar32 + iVar31 + iVar30 + iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar39 != 0) {
    printf("Module SAX2: %d errors\n",(ulong)uVar39);
  }
  return uVar39;
}

Assistant:

static int
test_SAX2(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing SAX2 : 38 of 38 functions ...\n");
    test_ret += test_docbDefaultSAXHandlerInit();
    test_ret += test_htmlDefaultSAXHandlerInit();
    test_ret += test_xmlDefaultSAXHandlerInit();
    test_ret += test_xmlSAX2AttributeDecl();
    test_ret += test_xmlSAX2CDataBlock();
    test_ret += test_xmlSAX2Characters();
    test_ret += test_xmlSAX2Comment();
    test_ret += test_xmlSAX2ElementDecl();
    test_ret += test_xmlSAX2EndDocument();
    test_ret += test_xmlSAX2EndElement();
    test_ret += test_xmlSAX2EndElementNs();
    test_ret += test_xmlSAX2EntityDecl();
    test_ret += test_xmlSAX2ExternalSubset();
    test_ret += test_xmlSAX2GetColumnNumber();
    test_ret += test_xmlSAX2GetEntity();
    test_ret += test_xmlSAX2GetLineNumber();
    test_ret += test_xmlSAX2GetParameterEntity();
    test_ret += test_xmlSAX2GetPublicId();
    test_ret += test_xmlSAX2GetSystemId();
    test_ret += test_xmlSAX2HasExternalSubset();
    test_ret += test_xmlSAX2HasInternalSubset();
    test_ret += test_xmlSAX2IgnorableWhitespace();
    test_ret += test_xmlSAX2InitDefaultSAXHandler();
    test_ret += test_xmlSAX2InitDocbDefaultSAXHandler();
    test_ret += test_xmlSAX2InitHtmlDefaultSAXHandler();
    test_ret += test_xmlSAX2InternalSubset();
    test_ret += test_xmlSAX2IsStandalone();
    test_ret += test_xmlSAX2NotationDecl();
    test_ret += test_xmlSAX2ProcessingInstruction();
    test_ret += test_xmlSAX2Reference();
    test_ret += test_xmlSAX2ResolveEntity();
    test_ret += test_xmlSAX2SetDocumentLocator();
    test_ret += test_xmlSAX2StartDocument();
    test_ret += test_xmlSAX2StartElement();
    test_ret += test_xmlSAX2StartElementNs();
    test_ret += test_xmlSAX2UnparsedEntityDecl();
    test_ret += test_xmlSAXDefaultVersion();
    test_ret += test_xmlSAXVersion();

    if (test_ret != 0)
	printf("Module SAX2: %d errors\n", test_ret);
    return(test_ret);
}